

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::core::ConfidentialTxIn::GetWitnessHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTxIn *this)

{
  bool bVar1;
  ByteData256 empty_data;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  ByteData256 local_78;
  ByteData local_60;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_48;
  ByteData local_28;
  
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = AbstractTxIn::IsCoinBase(&this->super_AbstractTxIn);
  if (bVar1) {
    ByteData::ByteData(&local_28);
    ByteData::Serialize(&local_60,&local_28);
    HashUtil::Sha256D(&local_78,&local_60);
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&local_48,&local_78);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&local_48,&local_78);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&local_48,&local_78);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&local_48,&local_78);
    local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  else {
    ByteData::Serialize(&local_60,&this->issuance_amount_rangeproof_);
    HashUtil::Sha256D(&local_78,&local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(&local_48,&local_78);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ByteData::Serialize(&local_60,&this->inflation_keys_rangeproof_);
    HashUtil::Sha256D(&local_78,&local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(&local_48,&local_78);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ScriptWitness::Serialize(&local_60,&(this->super_AbstractTxIn).script_witness_);
    HashUtil::Sha256D(&local_78,&local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(&local_48,&local_78);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ScriptWitness::Serialize(&local_60,&this->pegin_witness_);
    HashUtil::Sha256D(&local_78,&local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(&local_48,&local_78);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  CryptoUtil::ComputeFastMerkleRoot
            (__return_storage_ptr__,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_48);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_48)
  ;
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTxIn::GetWitnessHash() const {
  std::vector<ByteData256> leaves;
  if (IsCoinBase()) {
    ByteData256 empty_data = HashUtil::Sha256D(ByteData().Serialize());
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
  } else {
    leaves.push_back(
        HashUtil::Sha256D(issuance_amount_rangeproof_.Serialize()));
    leaves.push_back(
        HashUtil::Sha256D(inflation_keys_rangeproof_.Serialize()));
    leaves.push_back(HashUtil::Sha256D(script_witness_.Serialize()));
    leaves.push_back(HashUtil::Sha256D(pegin_witness_.Serialize()));
  }
  ByteData256 result = CryptoUtil::ComputeFastMerkleRoot(leaves);
  return result;
}